

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O1

int rehash(stmm_table *table)

{
  uint uVar1;
  stmm_table_entry **__ptr;
  stmm_table_entry *psVar2;
  stmm_hash_func_type p_Var3;
  int iVar4;
  stmm_table_entry **ppsVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  stmm_table_entry *psVar10;
  
  __ptr = table->bins;
  uVar1 = table->num_bins;
  iVar4 = table->num_entries;
  uVar9 = (uint)((double)(int)uVar1 * table->grow_factor);
  uVar7 = uVar9 | 1;
  table->num_bins = uVar7;
  table->num_entries = 0;
  ppsVar5 = (stmm_table_entry **)malloc((long)(int)uVar7 << 3);
  table->bins = ppsVar5;
  if (ppsVar5 == (stmm_table_entry **)0x0) {
    table->bins = __ptr;
    table->num_bins = uVar1;
    table->num_entries = iVar4;
    iVar4 = -10000;
  }
  else {
    if (-1 < (int)uVar9) {
      uVar6 = 0;
      do {
        table->bins[uVar6] = (stmm_table_entry *)0x0;
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        psVar10 = __ptr[uVar6];
        while (psVar10 != (stmm_table_entry *)0x0) {
          psVar2 = psVar10->next;
          p_Var3 = table->hash;
          if (p_Var3 == stmm_ptrhash) {
            iVar4 = (int)(((ulong)psVar10->key >> 2) % (ulong)(long)table->num_bins);
          }
          else if (p_Var3 == stmm_numhash) {
            iVar8 = (int)psVar10->key;
            iVar4 = -iVar8;
            if (0 < iVar8) {
              iVar4 = iVar8;
            }
            iVar4 = iVar4 % table->num_bins;
          }
          else {
            iVar4 = (*p_Var3)(psVar10->key,table->num_bins);
          }
          ppsVar5 = table->bins;
          psVar10->next = ppsVar5[iVar4];
          ppsVar5[iVar4] = psVar10;
          table->num_entries = table->num_entries + 1;
          psVar10 = psVar2;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar1);
    }
    iVar4 = 1;
    if (__ptr != (stmm_table_entry **)0x0) {
      free(__ptr);
    }
  }
  return iVar4;
}

Assistant:

static int
rehash (stmm_table *table)
{
    stmm_table_entry *ptr, *next, **old_bins;
    int i, old_num_bins, hash_val, old_num_entries;

    /* save old values */
    old_bins = table->bins;
    old_num_bins = table->num_bins;
    old_num_entries = table->num_entries;

    /* rehash */
    table->num_bins = (int) (table->grow_factor * old_num_bins);
    if (table->num_bins % 2 == 0) {
    table->num_bins += 1;
    }
    table->num_entries = 0;
    table->bins = ABC_ALLOC(stmm_table_entry *, table->num_bins);
    if (table->bins == NULL) {
    table->bins = old_bins;
    table->num_bins = old_num_bins;
    table->num_entries = old_num_entries;
    return STMM_OUT_OF_MEM;
    }
    /* initialize */
    for (i = 0; i < table->num_bins; i++) {
    table->bins[i] = 0;
    }

    /* copy data over */
    for (i = 0; i < old_num_bins; i++) {
    ptr = old_bins[i];
    while (ptr != NULL) {
        next = ptr->next;
        hash_val = do_hash (ptr->key, table);
        ptr->next = table->bins[hash_val];
        table->bins[hash_val] = ptr;
        table->num_entries++;
        ptr = next;
    }
    }
    ABC_FREE(old_bins);

    return 1;
}